

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O3

void __thiscall wasm::DataFlowOpts::doWalkFunction(DataFlowOpts *this,Function *func)

{
  pointer puVar1;
  const_iterator __it;
  Node *node_00;
  pointer ppLVar2;
  mapped_type pNVar3;
  long *plVar4;
  mapped_type pNVar5;
  mapped_type *ppNVar6;
  size_t in_RCX;
  uchar *in_R8;
  size_t in_R9;
  unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> *node;
  pointer puVar7;
  __hashtable *__h;
  pointer ppLVar8;
  undefined1 auStack_118 [8];
  unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
  optimized;
  _Head_base<0UL,_wasm::DataFlow::Node_*,_false> local_40;
  LocalSet *local_38;
  LocalSet *set;
  
  auStack_118 = (undefined1  [8])0x0;
  optimized._M_h._M_buckets = (__buckets_ptr)0x0;
  Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::walk
            ((Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_> *)
             auStack_118,&func->body);
  Flat::anon_func::VerifyFlatness::verify
            ((VerifyFlatness *)auStack_118,(EVP_PKEY_CTX *)(ulong)((func->body->type).id < 2),
             (uchar *)"function bodies must not flow values",in_RCX,in_R8,in_R9);
  DataFlow::Graph::build
            (&this->graph,func,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
             ).super_PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>.
             super_Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>.currModule);
  DataFlow::Users::build(&this->nodeUsers,&this->graph);
  auStack_118 = (undefined1  [8])&optimized._M_h._M_rehash_policy._M_next_resize;
  optimized._M_h._M_buckets = (__buckets_ptr)0x1;
  optimized._M_h._M_bucket_count = 0;
  optimized._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optimized._M_h._M_element_count._0_4_ = 0x3f800000;
  optimized._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optimized._M_h._M_rehash_policy._4_4_ = 0;
  optimized._M_h._M_rehash_policy._M_next_resize = 0;
  puVar7 = (this->graph).nodes.
           super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->graph).nodes.
           super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    do {
      local_40._M_head_impl =
           (puVar7->_M_t).
           super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
           .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl;
      local_38 = (LocalSet *)&this->workLeft;
      std::
      _Hashtable<wasm::DataFlow::Node*,wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>,std::__detail::_Identity,std::equal_to<wasm::DataFlow::Node*>,std::hash<wasm::DataFlow::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<wasm::DataFlow::Node*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::DataFlow::Node*,false>>>>
                ((_Hashtable<wasm::DataFlow::Node*,wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>,std::__detail::_Identity,std::equal_to<wasm::DataFlow::Node*>,std::hash<wasm::DataFlow::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->workLeft,&local_40,&local_38);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  while ((this->workLeft)._M_h._M_element_count != 0) {
    __it.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>._M_cur =
         (_Node_iterator_base<wasm::DataFlow::Node_*,_false>)
         (this->workLeft)._M_h._M_before_begin._M_nxt;
    node_00 = *(Node **)((long)__it.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>._M_cur
                        + 8);
    std::
    _Hashtable<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::erase(&(this->workLeft)._M_h,__it);
    workOn(this,node_00);
  }
  ppLVar8 = (this->graph).sets.
            super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppLVar2 = (this->graph).sets.
            super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppLVar8 != ppLVar2) {
    do {
      local_38 = *ppLVar8;
      ppNVar6 = std::__detail::
                _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&(this->graph).setNodeMap,&local_38);
      pNVar3 = *ppNVar6;
      if (*(long **)((long)auStack_118 + ((ulong)pNVar3 % (ulong)optimized._M_h._M_buckets) * 8) !=
          (long *)0x0) {
        plVar4 = (long *)**(long **)((long)auStack_118 +
                                    ((ulong)pNVar3 % (ulong)optimized._M_h._M_buckets) * 8);
        pNVar5 = (mapped_type)plVar4[1];
        while (pNVar3 != pNVar5) {
          plVar4 = (long *)*plVar4;
          if ((plVar4 == (long *)0x0) ||
             (pNVar5 = (mapped_type)plVar4[1],
             (ulong)pNVar5 % (ulong)optimized._M_h._M_buckets !=
             (ulong)pNVar3 % (ulong)optimized._M_h._M_buckets)) goto LAB_00823c39;
        }
        if (pNVar3->type != Expr) {
          __assert_fail("node->isExpr()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                        ,0x4f,"void wasm::DataFlowOpts::doWalkFunction(Function *)");
        }
        local_38->value = (Expression *)pNVar3->field_1;
      }
LAB_00823c39:
      ppLVar8 = ppLVar8 + 1;
    } while (ppLVar8 != ppLVar2);
  }
  std::
  _Hashtable<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)auStack_118);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    Flat::verifyFlatness(func);
    // Build the data-flow IR.
    graph.build(func, getModule());
    nodeUsers.build(graph);
    // Propagate optimizations through the graph.
    std::unordered_set<DataFlow::Node*> optimized; // which nodes we optimized
    for (auto& node : graph.nodes) {
      workLeft.insert(node.get()); // we should try to optimize each node
    }
    while (!workLeft.empty()) {
      // std::cout << "\n\ndump before work iter\n";
      // dump(graph, std::cout);
      auto iter = workLeft.begin();
      auto* node = *iter;
      workLeft.erase(iter);
      workOn(node);
    }
    // After updating the DataFlow IR, we can update the sets in
    // the wasm.
    // TODO: we also need phis, as a phi can flow directly into say
    //       a return or a call parameter.
    for (auto* set : graph.sets) {
      auto* node = graph.setNodeMap[set];
      auto iter = optimized.find(node);
      if (iter != optimized.end()) {
        assert(node->isExpr()); // this is a set, where the node is defined
        set->value = node->expr;
      }
    }
  }